

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_serialize_set_element
          (t_cpp_generator *this,ostream *out,t_set *tset,string *iter)

{
  t_type *type;
  t_field efield;
  allocator local_151;
  string local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  t_field local_d0;
  
  type = tset->elem_type_;
  std::operator+(&local_110,"(*",iter);
  std::operator+(&local_f0,&local_110,")");
  t_field::t_field(&local_d0,type,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,"",(allocator *)&local_110);
  std::__cxx11::string::string((string *)&local_150,"",&local_151);
  generate_serialize_field(this,out,&local_d0,&local_130,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_130);
  t_field::~t_field(&local_d0);
  return;
}

Assistant:

void t_cpp_generator::generate_serialize_set_element(ostream& out, t_set* tset, string iter) {
  t_field efield(tset->get_elem_type(), "(*" + iter + ")");
  generate_serialize_field(out, &efield, "");
}